

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RelationsAnalyzer.cpp
# Opt level: O2

bool __thiscall
dg::vr::RelationsAnalyzer::mayHaveAlias(RelationsAnalyzer *this,ValueRelations *graph,V val)

{
  V from;
  bool bVar1;
  pointer ppVVar2;
  _Vector_base<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_> local_40;
  
  ValueRelations::getEqual((VectorSet<const_llvm::Value_*> *)&local_40,graph,val);
  do {
    ppVVar2 = local_40._M_impl.super__Vector_impl_data._M_start;
    if (ppVVar2 == local_40._M_impl.super__Vector_impl_data._M_finish) break;
    from = *ppVVar2;
    bVar1 = hasKnownOrigin(graph,from);
    if (!bVar1) break;
    bVar1 = mayHaveAlias(this,from);
    local_40._M_impl.super__Vector_impl_data._M_start = ppVVar2 + 1;
  } while (!bVar1);
  std::_Vector_base<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>::~_Vector_base
            (&local_40);
  return ppVVar2 != local_40._M_impl.super__Vector_impl_data._M_finish;
}

Assistant:

bool RelationsAnalyzer::mayHaveAlias(const ValueRelations &graph, V val) const {
    for (const auto *eqval : graph.getEqual(val)) {
        if (!hasKnownOrigin(graph, eqval) || mayHaveAlias(eqval))
            return true;
    }
    return false;
}